

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

bool tcu::isFixedPointDepthTextureFormat(TextureFormat *format)

{
  TextureChannelClass TVar1;
  TextureChannelClass channelClass;
  TextureFormat *format_local;
  
  TVar1 = getTextureChannelClass(format->type);
  if (TVar1 == TEXTURECHANNELCLASS_FLOATING_POINT) {
    format_local._7_1_ = false;
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    format_local._7_1_ = true;
  }
  else {
    format_local._7_1_ = false;
  }
  return format_local._7_1_;
}

Assistant:

static bool isFixedPointDepthTextureFormat (const tcu::TextureFormat& format)
{
	DE_ASSERT(format.order == TextureFormat::D);

	const tcu::TextureChannelClass channelClass = tcu::getTextureChannelClass(format.type);
	if (channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
		return false;
	else if (channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		return true;
	else
	{
		DE_ASSERT(false);
		return false;
	}
}